

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

int envy_bios_parse_xpio(envy_bios *bios,envy_bios_xpio *xpio,int idx)

{
  uint8_t *res;
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  envy_bios_gpio_entry *peVar14;
  uint uVar15;
  ulong uVar16;
  char *__format;
  ulong uVar17;
  uint8_t bytes [5];
  uint8_t byte2;
  uint8_t *local_50;
  int local_44;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (xpio->offset == 0) {
LAB_00255bf0:
    iVar7 = 0;
  }
  else {
    local_38 = &xpio->version;
    local_44 = idx;
    iVar7 = bios_u8(bios,(uint)xpio->offset,local_38);
    local_40 = &xpio->hlen;
    iVar8 = bios_u8(bios,xpio->offset + 1,local_40);
    local_50 = &xpio->entriesnum;
    iVar9 = bios_u8(bios,xpio->offset + 2,local_50);
    res = &xpio->rlen;
    iVar10 = bios_u8(bios,xpio->offset + 3,res);
    iVar11 = bios_u8(bios,xpio->offset + 4,&xpio->type);
    iVar12 = bios_u8(bios,xpio->offset + 5,&xpio->addr);
    iVar13 = bios_u8(bios,xpio->offset + 6,&byte2);
    puVar5 = local_38;
    puVar4 = local_40;
    if (iVar13 != 0 ||
        ((iVar12 != 0 || iVar11 != 0) || ((iVar10 != 0 || iVar9 != 0) || (iVar8 != 0 || iVar7 != 0))
        )) {
      return -0xe;
    }
    envy_bios_block(bios,(uint)xpio->offset,
                    (uint)xpio->entriesnum * (uint)xpio->rlen + (uint)xpio->hlen,"XPIO",local_44);
    xpio->unk02_0 = byte2 & 0xf;
    xpio->bus = byte2 >> 4 & 1;
    xpio->unk02_5 = byte2 >> 5;
    bVar6 = xpio->version;
    if (bVar6 != (bios->gpio).xpiodir.version) {
      fwrite("XPIO version mismatch with XPIODIR\n",0x23,1,_stderr);
      bVar6 = *puVar5;
    }
    if (bVar6 == 0x30) {
      uVar15 = 2;
LAB_0025592c:
      bVar6 = *puVar4;
      uVar17 = (ulong)bVar6;
      if (bVar6 < 7) {
        __format = "XPIO table header too short [%d < %d]\n";
        uVar16 = 7;
      }
      else {
        bVar1 = *res;
        uVar17 = (ulong)bVar1;
        if (uVar15 <= bVar1) {
          if (bVar6 != 7) {
            fprintf(_stderr,"XPIO table header longer than expected [%d > %d]\n");
            bVar1 = *res;
          }
          if (uVar15 < bVar1) {
            fprintf(_stderr,"XPIO table record longer than expected [%d > %d]\n",(ulong)(uint)bVar1)
            ;
          }
          bVar6 = xpio->entriesnum;
          peVar14 = (envy_bios_gpio_entry *)calloc((ulong)bVar6,0x12);
          xpio->entries = peVar14;
          if (peVar14 == (envy_bios_gpio_entry *)0x0) {
            return -0xc;
          }
          for (uVar17 = 0; uVar17 < bVar6; uVar17 = uVar17 + 1) {
            peVar14 = xpio->entries + uVar17;
            xpio->entries[uVar17].offset =
                 (ushort)xpio->rlen * (short)uVar17 + (ushort)xpio->hlen + xpio->offset;
            bytes[4] = '\0';
            bytes[0] = '\0';
            bytes[1] = '\0';
            bytes[2] = '\0';
            bytes[3] = '\0';
            uVar16 = 0;
            while ((uVar16 != 5 && (uVar16 < *res))) {
              iVar7 = bios_u8(bios,(uint)peVar14->offset + (int)uVar16,bytes + uVar16);
              uVar16 = uVar16 + 1;
              if (iVar7 != 0) {
                return -0xe;
              }
            }
            bVar6 = (bios->gpio).version;
            uVar2 = bytes[0];
            uVar3 = bytes[1];
            if (bVar6 - 0x30 < 2) {
              if (*res < 2) {
                return -0xe;
              }
              peVar14->line = uVar2 & 0x1f;
              peVar14->tag = (byte)((ushort)bytes._0_2_ >> 5) & 0x3f;
              peVar14->log[0] = uVar3 >> 3 & 3;
              peVar14->log[1] = uVar3 >> 5 & 3;
              peVar14->param = uVar3 >> 7;
            }
            else if (bVar6 == 0x40) {
              if (*res < 4) {
                return -0xe;
              }
              peVar14->line = bytes[0] & 0x1f;
              peVar14->unk40_0 = bytes[0] >> 5;
              peVar14->tag = bytes[1];
              peVar14->unk40_2 = bytes[2];
              peVar14->def = bytes[3] & 1;
              peVar14->mode = bytes[3] >> 1 & 3;
              peVar14->log[0] = bytes[3] >> 3 & 3;
              peVar14->log[1] = bytes[3] >> 5 & 3;
              peVar14->param = bytes[3] >> 7;
            }
            else {
              if (bVar6 != 0x41) {
                abort();
              }
              if (*res < 5) {
                return -0xe;
              }
              peVar14->line = bytes[0] & 0x3f;
              peVar14->io = bytes[0] >> 6 & 1;
              peVar14->def = bytes[0] >> 7;
              peVar14->tag = bytes[1];
              peVar14->spec_out = bytes[2];
              peVar14->spec_in = bytes[3] & 0x1f;
              peVar14->gsync = bytes[3] >> 5 & 1;
              peVar14->reserved = bytes[3] >> 6 & 1;
              peVar14->param = bytes[3] >> 7;
              peVar14->lockpin = bytes[4] & 0xf;
              peVar14->log[0] = bytes[4] >> 4 & 3;
              peVar14->log[1] = bytes[4] >> 6;
            }
            bVar6 = *local_50;
          }
          xpio->valid = '\x01';
          goto LAB_00255bf0;
        }
        __format = "XPIO table record too short [%d < %d]\n";
        uVar16 = (ulong)uVar15;
      }
    }
    else {
      if (bVar6 == 0x40) {
        if ((bios->gpio).version == 'A') {
          uVar15 = 5;
        }
        else {
          uVar15 = 4;
          if (*res == '\x02') {
            fwrite("XPIO version 4.0 with 2-byte entries!\n",0x26,1,_stderr);
            *res = '\x04';
          }
        }
        goto LAB_0025592c;
      }
      uVar17 = (ulong)(bVar6 >> 4);
      uVar16 = (ulong)(bVar6 & 0xf);
      __format = "Unknown XPIO table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar17,uVar16);
    iVar7 = -0x16;
  }
  return iVar7;
}

Assistant:

int envy_bios_parse_xpio (struct envy_bios *bios, struct envy_bios_xpio *xpio, int idx) {
	if (!xpio->offset)
		return 0;
	int err = 0;
	uint8_t byte2;
	err |= bios_u8(bios, xpio->offset, &xpio->version);
	err |= bios_u8(bios, xpio->offset+1, &xpio->hlen);
	err |= bios_u8(bios, xpio->offset+2, &xpio->entriesnum);
	err |= bios_u8(bios, xpio->offset+3, &xpio->rlen);
	err |= bios_u8(bios, xpio->offset+4, &xpio->type);
	err |= bios_u8(bios, xpio->offset+5, &xpio->addr);
	err |= bios_u8(bios, xpio->offset+6, &byte2);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, xpio->offset, xpio->hlen + xpio->rlen * xpio->entriesnum, "XPIO", idx);
	xpio->unk02_0 = byte2 & 0xf;
	xpio->bus = byte2 >> 4 & 1;
	xpio->unk02_5 = byte2 >> 5;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpio->version != bios->gpio.xpiodir.version)
		ENVY_BIOS_WARN("XPIO version mismatch with XPIODIR\n");
	switch (xpio->version) {
		case 0x30:
			wanthlen = 7;
			wantrlen = 2;
			break;
		case 0x40:
			wanthlen = 7;
			wantrlen = 4;
			if (bios->gpio.version == 0x41)
				wantrlen = 5;
			else if (xpio->rlen == 2) {
				ENVY_BIOS_WARN("XPIO version 4.0 with 2-byte entries!\n");
				xpio->rlen = 4;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIO table version %d.%d\n", xpio->version >> 4, xpio->version & 0xf);
			return -EINVAL;
	}
	if (xpio->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIO table header too short [%d < %d]\n", xpio->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpio->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIO table record too short [%d < %d]\n", xpio->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpio->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIO table header longer than expected [%d > %d]\n", xpio->hlen, wanthlen);
	}
	if (xpio->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIO table record longer than expected [%d > %d]\n", xpio->rlen, wantrlen);
	}
	xpio->entries = calloc(xpio->entriesnum, sizeof *xpio->entries);
	if (!xpio->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpio->entriesnum; i++) {
		struct envy_bios_gpio_entry *entry = &xpio->entries[i];
		entry->offset = xpio->offset + xpio->hlen + xpio->rlen * i;
		/* note: structure is the same as GPIO, but tags are different, and some fields don't make sense */
		uint8_t bytes[5] = { 0 };
		int j;
		for (j = 0; j < 5 && j < xpio->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		uint16_t val;
		/* because someone forgot to bump XPIO version number on 4.1... */
		switch (bios->gpio.version) {
			case 0x30:
			case 0x31:
				if (xpio->rlen < 2)
					return -EFAULT;
				val = bytes[0] | bytes[1] << 8;
				entry->line = val & 0x1f;
				entry->tag = val >> 5 & 0x3f;
				entry->log[0] = val >> 11 & 3;
				entry->log[1] = val >> 13 & 3;
				entry->param = val >> 15 & 1;
				break;
			case 0x40:
				if (xpio->rlen < 4)
					return -EFAULT;
				entry->line = bytes[0] & 0x1f;
				entry->unk40_0 = bytes[0] >> 5 & 7;
				entry->tag = bytes[1];
				entry->unk40_2 = bytes[2];
				entry->def = bytes[3] & 1;
				entry->mode = bytes[3] >> 1 & 3;
				entry->log[0] = bytes[3] >> 3 & 3;
				entry->log[1] = bytes[3] >> 5 & 3;
				entry->param = bytes[3] >> 7 & 1;
				break;
			case 0x41:
				if (xpio->rlen < 5)
					return -EFAULT;
				entry->line = bytes[0] & 0x3f;
				entry->io = bytes[0] >> 6 & 1;
				entry->def = bytes[0] >> 7 & 1;
				entry->tag = bytes[1];
				entry->spec_out = bytes[2];
				entry->spec_in = bytes[3] & 0x1f;
				entry->gsync = bytes[3] >> 5 & 1;
				entry->reserved = bytes[3] >> 6 & 1;
				entry->param = bytes[3] >> 7 & 1;
				entry->lockpin = bytes[4] & 0xf;
				entry->log[0] = bytes[4] >> 4 & 3;
				entry->log[1] = bytes[4] >> 6 & 3;
				break;
			default:
				abort();
		}
	}
	xpio->valid = 1;
	return 0;
}